

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O2

void drawImage2(Array2D<Imath_3_2::half> *gpx,Array2D<float> *zpx,int w,int h)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong unaff_RBP;
  Array2D<Imath_3_2::half> *this;
  int y;
  long lVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar27;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar28;
  float fVar29;
  float xl;
  
  lVar6 = 0;
  iVar7 = 0;
  if (0 < w) {
    iVar7 = w;
  }
  uVar3 = 0;
  if (0 < h) {
    uVar3 = (ulong)(uint)h;
  }
  lVar8 = 0;
  this = gpx;
  for (uVar4 = 0; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    for (unaff_RBP = 0; (uint)(iVar7 * 2) != unaff_RBP; unaff_RBP = unaff_RBP + 2) {
      this = (Array2D<Imath_3_2::half> *)((long)&gpx->_data->_h + unaff_RBP + gpx->_sizeY * lVar6);
      Imath_3_2::half::operator=((half *)this,0.0);
      *(undefined4 *)((long)zpx->_data + unaff_RBP * 2 + zpx->_sizeY * lVar8) = 0x7f7fffff;
    }
    lVar8 = lVar8 + 4;
    lVar6 = lVar6 + 2;
  }
  fVar28 = (float)w;
  fVar11 = (float)h + -1.0;
  for (iVar7 = 0; iVar7 != 2000; iVar7 = iVar7 + 1) {
    dVar16 = (double)(((float)(iVar7 * 2) * 3.1415927) / 2000.0);
    dVar17 = sin(dVar16 * 4.0);
    dVar18 = dVar16 * 15.0;
    dVar19 = sin(dVar18);
    dVar20 = cos(dVar16 * 3.0);
    dVar21 = cos(dVar18);
    dVar16 = sin(dVar16 * 5.0);
    dVar18 = sin(dVar18);
    fVar2 = (float)dVar16 * -0.5 + 0.5 + 0.2;
    fVar1 = (float)(dVar18 * 0.3 + 0.7) * fVar28 * 0.05;
    auVar25._0_4_ = (float)(dVar21 * 0.2 + dVar20) * (float)h;
    auVar25._4_4_ = (float)(dVar19 * 0.2 + dVar17) * fVar28;
    auVar25._8_8_ = 0;
    auVar26 = divps(auVar25,_DAT_0010b1d0);
    fVar22 = auVar26._0_4_ + (float)(h / 2);
    fVar27 = auVar26._4_4_ + (float)(w / 2);
    fVar12 = floorf(fVar27 - fVar1);
    fVar13 = ceilf(fVar1 + fVar22);
    fVar14 = ceilf(fVar1 + fVar27);
    iVar9 = -(uint)(fVar11 < fVar13);
    iVar10 = -(uint)(fVar28 + -1.0 < fVar14);
    auVar26._4_4_ = iVar9;
    auVar26._0_4_ = iVar9;
    auVar26._8_4_ = iVar10;
    auVar26._12_4_ = iVar10;
    uVar5 = movmskpd((int)unaff_RBP,auVar26);
    fVar23 = fVar28 + -1.0;
    if ((uVar5 & 2) == 0) {
      fVar23 = fVar14;
    }
    fVar15 = floorf(fVar22 - fVar1);
    fVar14 = fVar11;
    if ((uVar5 & 1) == 0) {
      fVar14 = fVar13;
    }
    fVar13 = 0.0;
    if (0.0 <= fVar12) {
      fVar13 = fVar12;
    }
    fVar12 = 0.0;
    if (0.0 <= fVar15) {
      fVar12 = fVar15;
    }
    for (unaff_RBP = (ulong)(int)fVar13; (long)unaff_RBP <= (long)(int)fVar23;
        unaff_RBP = unaff_RBP + 1) {
      fVar13 = ((float)(int)unaff_RBP - fVar27) / fVar1;
      for (lVar6 = (long)(int)fVar12; lVar6 <= (int)fVar14; lVar6 = lVar6 + 1) {
        fVar29 = ((float)(int)lVar6 - fVar22) / fVar1;
        fVar15 = SQRT(fVar13 * fVar13 + fVar29 * fVar29);
        if (fVar15 < 1.0) {
          fVar15 = 1.0 - fVar15 * fVar15;
          if (fVar15 < 0.0) {
            fVar15 = sqrtf(fVar15);
          }
          else {
            fVar15 = SQRT(fVar15);
          }
          fVar24 = -fVar1 * fVar15 + (float)dVar16 * fVar28 + (float)(w * 3);
          if (fVar24 < zpx->_data[zpx->_sizeY * lVar6 + unaff_RBP]) {
            fVar15 = fVar15 * 0.7071 + fVar13 * 0.42426 + fVar29 * -0.56568;
            fVar15 = (float)(-(uint)(fVar15 < 0.0) & (uint)(fVar15 * -0.1) |
                            ~-(uint)(fVar15 < 0.0) & (uint)fVar15);
            fVar29 = anon_unknown.dwarf_10e1::pw(fVar15,(int)this);
            this = (Array2D<Imath_3_2::half> *)(gpx->_data + gpx->_sizeY * lVar6 + unaff_RBP);
            Imath_3_2::half::operator=((half *)this,(fVar29 * 4.0 + fVar15) * fVar2 * 2.5 * fVar2);
            zpx->_data[zpx->_sizeY * lVar6 + unaff_RBP] = fVar24;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
drawImage2 (Array2D<half>& gpx, Array2D<float>& zpx, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            gpx[y][x] = 0;
            zpx[y][x] = FLT_MAX;
        }
    }

    int n = 2000;

    for (int i = 0; i < n; ++i)
    {
        float t  = (i * 2.0 * M_PI) / n;
        float xp = sin (t * 4.0) + 0.2 * sin (t * 15.0);
        float yp = cos (t * 3.0) + 0.2 * cos (t * 15.0);
        float zp = sin (t * 5.0);
        float rd = 0.7 + 0.3 * sin (t * 15.0);
        float gn = 0.5 - 0.5 * zp + 0.2;

        zsp (
            gpx,
            zpx,
            w,
            h,
            xp * w / 3 + w / 2,
            yp * h / 3 + h / 2,
            zp * w + 3 * w,
            w * rd * 0.05,
            2.5 * gn * gn);
    }
}